

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupHalfSeq(Gia_Man_t *p,int fSecond)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  
  pNew = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  pNew->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  pNew->pSpec = pcVar3;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  if (fSecond == 0) {
    for (iVar5 = 0; iVar5 < p->vCis->nSize - p->nRegs; iVar5 = iVar5 + 1) {
      pGVar4 = Gia_ManCi(p,iVar5);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar1 = Gia_ManAppendCi(pNew);
      pGVar4->Value = uVar1;
    }
    iVar5 = 0;
    while( true ) {
      if (p->nRegs <= iVar5) break;
      pGVar4 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar5);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if (p->nRegs / 2 <= iVar5) {
        uVar1 = Gia_ManAppendCi(pNew);
        pGVar4->Value = uVar1;
      }
      iVar5 = iVar5 + 1;
    }
    for (iVar5 = 0; iVar5 < p->nRegs; iVar5 = iVar5 + 1) {
      pGVar4 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar5);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if (iVar5 < p->nRegs / 2) {
        uVar1 = Gia_ManAppendCi(pNew);
        pGVar4->Value = uVar1;
      }
    }
    for (iVar5 = 0; iVar5 < p->vCos->nSize - p->nRegs; iVar5 = iVar5 + 1) {
      pGVar4 = Gia_ManCo(p,iVar5);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      Gia_ManDupOrderDfs_rec(pNew,p,pGVar4);
    }
    for (iVar5 = 0; iVar2 = p->nRegs, iVar5 < iVar2; iVar5 = iVar5 + 1) {
      pGVar4 = Gia_ManCo(p,(p->vCos->nSize - iVar2) + iVar5);
      iVar2 = p->nRegs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if (iVar5 < iVar2 / 2) {
        Gia_ManDupOrderDfs_rec(pNew,p,pGVar4);
      }
    }
    iVar2 = iVar2 / 2;
  }
  else {
    for (iVar5 = 0; iVar5 < p->vCis->nSize; iVar5 = iVar5 + 1) {
      pGVar4 = Gia_ManCi(p,iVar5);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar1 = Gia_ManAppendCi(pNew);
      pGVar4->Value = uVar1;
    }
    for (iVar5 = 0; iVar5 < p->vCos->nSize - p->nRegs; iVar5 = iVar5 + 1) {
      pGVar4 = Gia_ManCo(p,iVar5);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      Gia_ManDupOrderDfs_rec(pNew,p,pGVar4);
    }
    for (iVar5 = 0; iVar2 = p->nRegs, iVar5 < iVar2; iVar5 = iVar5 + 1) {
      pGVar4 = Gia_ManCo(p,(p->vCos->nSize - iVar2) + iVar5);
      iVar2 = p->nRegs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if (iVar2 / 2 <= iVar5) {
        Gia_ManDupOrderDfs_rec(pNew,p,pGVar4);
      }
    }
    iVar2 = iVar2 / -2 + iVar2;
  }
  Gia_ManSetRegNum(pNew,iVar2);
  return pNew;
}

Assistant:

Gia_Man_t * Gia_ManDupHalfSeq( Gia_Man_t * p, int fSecond )
{
    int i; Gia_Obj_t * pObj;
    Gia_Man_t * pNew = Gia_ManStart( Gia_ManObjNum(p) ); 
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    if ( fSecond )
    {
        Gia_ManForEachCi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachPo( p, pObj, i )
            Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManForEachRi( p, pObj, i )
            if ( i >= Gia_ManRegNum(p)/2 )
                Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p)- Gia_ManRegNum(p)/2 );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRo( p, pObj, i )
            if ( i >= Gia_ManRegNum(p)/2 )
                pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRo( p, pObj, i )
            if ( i < Gia_ManRegNum(p)/2 )
                pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachPo( p, pObj, i )
            Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManForEachRi( p, pObj, i )
            if ( i < Gia_ManRegNum(p)/2 )
                Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p)/2 );
    }
    return pNew;
}